

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcMasterTable.cpp
# Opt level: O0

void __thiscall GrcMasterTable::SetupFeatures(GrcMasterTable *this,GrcSymbolTable *psymtbl)

{
  GrcSymbolTableEntry *this_00;
  bool bVar1;
  pointer ppVar2;
  GdlDefn *pGVar3;
  GdlFeatureDefn *pfeat;
  GrcMasterValueList *pmvl;
  Symbol psymFeatName;
  iterator itvlistmap;
  GrcSymbolTable *in_stack_00000a90;
  GdlFeatureDefn *in_stack_00000a98;
  GrcMasterValueList *in_stack_00000aa0;
  GrcMasterTable *in_stack_ffffffffffffffa8;
  _Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>
  *in_stack_ffffffffffffffb0;
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node = (_Base_ptr)EntriesBegin(in_stack_ffffffffffffffa8);
  while( true ) {
    local_20._M_node = (_Base_ptr)EntriesEnd(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>::
             operator->(in_stack_ffffffffffffffb0);
    this_00 = ppVar2->first;
    std::_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>::operator->
              (in_stack_ffffffffffffffb0);
    pGVar3 = GrcSymbolTableEntry::Data(this_00);
    if (pGVar3 == (GdlDefn *)0x0) {
      in_stack_ffffffffffffffb0 =
           (_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_> *)0x0;
    }
    else {
      in_stack_ffffffffffffffb0 =
           (_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_> *)
           __dynamic_cast(pGVar3,&GdlDefn::typeinfo,&GdlFeatureDefn::typeinfo,0);
    }
    GrcMasterValueList::SetupFeatures(in_stack_00000aa0,in_stack_00000a98,in_stack_00000a90);
    std::_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>::operator++
              (in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void GrcMasterTable::SetupFeatures(GrcSymbolTable * psymtbl)
{
	for (ValueListMap::iterator itvlistmap = EntriesBegin();
		itvlistmap != EntriesEnd();
		++itvlistmap)
	{
		Symbol psymFeatName = itvlistmap->first;  // GetKey();
		GrcMasterValueList * pmvl = itvlistmap->second; //GetValue();

		Assert(psymFeatName->FitsSymbolType(ksymtFeature));

		GdlFeatureDefn * pfeat = dynamic_cast<GdlFeatureDefn*>(psymFeatName->Data());
		Assert(pfeat);

		pmvl->SetupFeatures(pfeat, psymtbl);
	}
}